

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O2

REF_STATUS ref_subdiv_mark_relax(REF_SUBDIV ref_subdiv)

{
  int iVar1;
  REF_CELL ref_cell;
  REF_INT *pRVar2;
  uint uVar3;
  REF_INT RVar4;
  REF_INT RVar5;
  REF_INT RVar6;
  REF_INT RVar7;
  REF_GRID pRVar8;
  REF_INT *pRVar9;
  REF_CELL *ppRVar10;
  undefined8 uVar11;
  long lVar12;
  uint uVar13;
  char *pcVar14;
  REF_BOOL RVar15;
  int cell;
  REF_BOOL again;
  uint local_48;
  REF_INT local_44;
  REF_INT local_40;
  REF_INT nmark;
  long local_38;
  
  uVar3 = ref_edge_ghost_int(ref_subdiv->edge,ref_subdiv->grid->mpi,ref_subdiv->mark);
  if (uVar3 == 0) {
    again = 1;
    uVar13 = 0;
    do {
      lVar12 = 8;
      if (again == 0) {
        if (ref_subdiv->instrument == 0) {
          return 0;
        }
        uVar3 = ref_subdiv_mark_n(ref_subdiv,&nmark);
        if (uVar3 == 0) {
          if (ref_subdiv->grid->mpi->id != 0) {
            return 0;
          }
          printf(" %d edges marked after %d relaxations\n",(ulong)(uint)nmark,(ulong)uVar13);
          return 0;
        }
        pcVar14 = "count";
        uVar11 = 0x1a7;
        goto LAB_001cc4e8;
      }
      again = 0;
      local_48 = uVar13 + 1;
      pRVar8 = ref_subdiv->grid;
      ppRVar10 = pRVar8->cell + 8;
      while (lVar12 != 0x10) {
        ref_cell = *ppRVar10;
        local_38 = lVar12;
        for (cell = 0; cell < ref_cell->max; cell = cell + 1) {
          if (ref_cell->c2n[(long)cell * (long)ref_cell->size_per] != -1) {
            iVar1 = ref_cell->node_per;
            if (iVar1 == 6) {
              RVar4 = ref_subdiv_c2e(ref_subdiv,ref_cell,0,cell);
              RVar5 = ref_subdiv_c2e(ref_subdiv,ref_cell,6,cell);
              pRVar2 = ref_subdiv->mark;
              RVar15 = 1;
              if (pRVar2[RVar4] != pRVar2[RVar5]) {
                pRVar2[RVar4] = 1;
                pRVar2[RVar5] = 1;
                again = RVar15;
              }
              RVar4 = ref_subdiv_c2e(ref_subdiv,ref_cell,3,cell);
              RVar5 = ref_subdiv_c2e(ref_subdiv,ref_cell,8,cell);
              pRVar2 = ref_subdiv->mark;
              if (pRVar2[RVar4] != pRVar2[RVar5]) {
                pRVar2[RVar4] = 1;
                pRVar2[RVar5] = 1;
                again = RVar15;
              }
              RVar4 = ref_subdiv_c2e(ref_subdiv,ref_cell,1,cell);
              RVar5 = ref_subdiv_c2e(ref_subdiv,ref_cell,7,cell);
              pRVar2 = ref_subdiv->mark;
              if (pRVar2[RVar4] != pRVar2[RVar5]) {
                pRVar2[RVar4] = 1;
                pRVar2[RVar5] = 1;
                again = RVar15;
              }
              RVar4 = ref_subdiv_c2e(ref_subdiv,ref_cell,0,cell);
              RVar5 = ref_subdiv_c2e(ref_subdiv,ref_cell,1,cell);
              RVar6 = ref_subdiv_c2e(ref_subdiv,ref_cell,3,cell);
              pRVar2 = ref_subdiv->mark;
              if (pRVar2[RVar5] + pRVar2[RVar4] + pRVar2[RVar6] == 2) {
                pRVar2[RVar4] = 1;
                pRVar2[RVar5] = 1;
                pRVar2[RVar6] = 1;
                again = RVar15;
              }
              RVar4 = ref_subdiv_c2e(ref_subdiv,ref_cell,6,cell);
              RVar5 = ref_subdiv_c2e(ref_subdiv,ref_cell,7,cell);
              RVar6 = ref_subdiv_c2e(ref_subdiv,ref_cell,8,cell);
              pRVar2 = ref_subdiv->mark;
              if (pRVar2[RVar5] + pRVar2[RVar4] + pRVar2[RVar6] == 2) {
                pRVar9 = pRVar2 + RVar6;
                again = 1;
                pRVar2[RVar4] = 1;
                pRVar2[RVar5] = 1;
LAB_001cc461:
                *pRVar9 = 1;
              }
            }
            else {
              RVar15 = 1;
              if (iVar1 == 5) {
                RVar4 = ref_subdiv_c2e(ref_subdiv,ref_cell,0,cell);
                RVar5 = ref_subdiv_c2e(ref_subdiv,ref_cell,7,cell);
                pRVar2 = ref_subdiv->mark;
                if (pRVar2[RVar4] != pRVar2[RVar5]) {
                  pRVar2[RVar4] = 1;
                  pRVar2[RVar5] = 1;
                  again = RVar15;
                }
                RVar4 = ref_subdiv_c2e(ref_subdiv,ref_cell,2,cell);
                RVar5 = ref_subdiv_c2e(ref_subdiv,ref_cell,4,cell);
                pRVar2 = ref_subdiv->mark;
                if (pRVar2[RVar4] != pRVar2[RVar5]) {
                  pRVar9 = pRVar2 + RVar5;
                  again = 1;
                  pRVar2[RVar4] = 1;
                  goto LAB_001cc461;
                }
              }
              else {
                if (iVar1 != 4) {
                  pcVar14 = "implement cell type";
                  uVar11 = 0x199;
                  uVar3 = 6;
                  goto LAB_001cc4e8;
                }
                RVar4 = ref_subdiv_c2e(ref_subdiv,ref_cell,3,cell);
                RVar5 = ref_subdiv_c2e(ref_subdiv,ref_cell,4,cell);
                RVar6 = ref_subdiv_c2e(ref_subdiv,ref_cell,5,cell);
                pRVar2 = ref_subdiv->mark;
                if (pRVar2[RVar5] + pRVar2[RVar4] + pRVar2[RVar6] == 2) {
                  pRVar2[RVar4] = 1;
                  pRVar2[RVar5] = 1;
                  pRVar2[RVar6] = 1;
                  again = RVar15;
                }
                RVar4 = ref_subdiv_c2e(ref_subdiv,ref_cell,1,cell);
                RVar5 = ref_subdiv_c2e(ref_subdiv,ref_cell,2,cell);
                RVar6 = ref_subdiv_c2e(ref_subdiv,ref_cell,5,cell);
                pRVar2 = ref_subdiv->mark;
                if (pRVar2[RVar5] + pRVar2[RVar4] + pRVar2[RVar6] == 2) {
                  pRVar2[RVar4] = 1;
                  pRVar2[RVar5] = 1;
                  pRVar2[RVar6] = 1;
                  again = RVar15;
                }
                RVar4 = ref_subdiv_c2e(ref_subdiv,ref_cell,0,cell);
                RVar5 = ref_subdiv_c2e(ref_subdiv,ref_cell,2,cell);
                RVar6 = ref_subdiv_c2e(ref_subdiv,ref_cell,4,cell);
                pRVar2 = ref_subdiv->mark;
                if (pRVar2[RVar5] + pRVar2[RVar4] + pRVar2[RVar6] == 2) {
                  pRVar2[RVar4] = 1;
                  pRVar2[RVar5] = 1;
                  pRVar2[RVar6] = 1;
                  again = RVar15;
                }
                RVar4 = ref_subdiv_c2e(ref_subdiv,ref_cell,0,cell);
                RVar5 = ref_subdiv_c2e(ref_subdiv,ref_cell,1,cell);
                RVar6 = ref_subdiv_c2e(ref_subdiv,ref_cell,3,cell);
                pRVar2 = ref_subdiv->mark;
                if (pRVar2[RVar5] + pRVar2[RVar4] + pRVar2[RVar6] == 2) {
                  pRVar2[RVar4] = 1;
                  pRVar2[RVar5] = 1;
                  pRVar2[RVar6] = 1;
                  again = RVar15;
                }
                local_40 = ref_subdiv_c2e(ref_subdiv,ref_cell,0,cell);
                local_44 = ref_subdiv_c2e(ref_subdiv,ref_cell,1,cell);
                RVar4 = ref_subdiv_c2e(ref_subdiv,ref_cell,2,cell);
                RVar5 = ref_subdiv_c2e(ref_subdiv,ref_cell,3,cell);
                RVar6 = ref_subdiv_c2e(ref_subdiv,ref_cell,4,cell);
                RVar7 = ref_subdiv_c2e(ref_subdiv,ref_cell,5,cell);
                pRVar2 = ref_subdiv->mark;
                if ((pRVar2[local_44] + pRVar2[local_40] + pRVar2[RVar4] + pRVar2[RVar5] +
                     pRVar2[RVar6] + pRVar2[RVar7] == 2) &&
                   (((0 < local_40 && 0 < RVar7 || (0 < local_44 && 0 < RVar6)) ||
                    (3 < local_44 && 0 < RVar4)))) {
                  again = 1;
                  RVar4 = ref_subdiv_c2e(ref_subdiv,ref_cell,0,cell);
                  pRVar2[RVar4] = 1;
                  pRVar2 = ref_subdiv->mark;
                  RVar4 = ref_subdiv_c2e(ref_subdiv,ref_cell,1,cell);
                  pRVar2[RVar4] = 1;
                  pRVar2 = ref_subdiv->mark;
                  RVar4 = ref_subdiv_c2e(ref_subdiv,ref_cell,2,cell);
                  pRVar2[RVar4] = 1;
                  pRVar2 = ref_subdiv->mark;
                  RVar4 = ref_subdiv_c2e(ref_subdiv,ref_cell,3,cell);
                  pRVar2[RVar4] = 1;
                  pRVar2 = ref_subdiv->mark;
                  RVar4 = ref_subdiv_c2e(ref_subdiv,ref_cell,4,cell);
                  pRVar2[RVar4] = 1;
                  pRVar9 = ref_subdiv->mark;
                  RVar4 = ref_subdiv_c2e(ref_subdiv,ref_cell,5,cell);
                  pRVar9 = pRVar9 + RVar4;
                  goto LAB_001cc461;
                }
              }
            }
          }
        }
        pRVar8 = ref_subdiv->grid;
        ppRVar10 = pRVar8->cell + local_38 + 1;
        lVar12 = local_38 + 1;
      }
      uVar3 = ref_edge_ghost_int(ref_subdiv->edge,pRVar8->mpi,ref_subdiv->mark);
      if (uVar3 != 0) {
        pcVar14 = "ghost mark";
        uVar11 = 0x1a1;
        goto LAB_001cc4e8;
      }
      uVar3 = ref_mpi_all_or(ref_subdiv->grid->mpi,&again);
      uVar13 = local_48;
    } while (uVar3 == 0);
    pcVar14 = "mpi all or";
    uVar11 = 0x1a3;
  }
  else {
    pcVar14 = "ghost mark";
    uVar11 = 0x17b;
  }
LAB_001cc4e8:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",uVar11,
         "ref_subdiv_mark_relax",(ulong)uVar3,pcVar14);
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_subdiv_mark_relax(REF_SUBDIV ref_subdiv) {
  REF_INT group, cell, nsweeps, nmark;
  REF_CELL ref_cell;
  REF_BOOL again;

  RSS(ref_edge_ghost_int(ref_subdiv_edge(ref_subdiv),
                         ref_subdiv_mpi(ref_subdiv), ref_subdiv->mark),
      "ghost mark");

  nsweeps = 0;
  again = REF_TRUE;
  while (again) {
    nsweeps++;
    again = REF_FALSE;

    each_ref_grid_3d_ref_cell(ref_subdiv_grid(ref_subdiv), group, ref_cell) {
      each_ref_cell_valid_cell(ref_cell, cell) {
        switch (ref_cell_node_per(ref_cell)) {
          case 4:
            promote_2_3(3, 4, 5);
            promote_2_3(1, 2, 5);
            promote_2_3(0, 2, 4);
            promote_2_3(0, 1, 3);
            promote_2_all();
            break;
          case 5:
            edge_or(0, 7); /* opposite quad edges */
            edge_or(2, 4); /* opposite quad edges */
            break;
          case 6:
            edge_or(0, 6);
            edge_or(3, 8);
            edge_or(1, 7);
            promote_2_3(0, 1, 3);
            promote_2_3(6, 7, 8);
            break;
          default:
            RSS(REF_IMPLEMENT, "implement cell type");
            break;
        }
      }
    }

    RSS(ref_edge_ghost_int(ref_subdiv_edge(ref_subdiv),
                           ref_subdiv_mpi(ref_subdiv), ref_subdiv->mark),
        "ghost mark");

    RSS(ref_mpi_all_or(ref_subdiv_mpi(ref_subdiv), &again), "mpi all or");
  }

  if (ref_subdiv->instrument) {
    RSS(ref_subdiv_mark_n(ref_subdiv, &nmark), "count");
    if (ref_mpi_once(ref_subdiv_mpi(ref_subdiv)))
      printf(" %d edges marked after %d relaxations\n", nmark, nsweeps);
  }

  return REF_SUCCESS;
}